

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O0

void * worker(void *arg)

{
  long lVar1;
  ecs_entity_t scope;
  ecs_entity_t old_scope;
  ecs_world_t *world;
  ecs_thread_t *thread;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  (*ecs_os_api.mutex_lock_)(*(ecs_os_mutex_t *)(lVar1 + 0x5bd0));
  *(int *)(lVar1 + 0x5bd8) = *(int *)(lVar1 + 0x5bd8) + 1;
  if ((*(byte *)(lVar1 + 0x5c90) & 1) == 0) {
    (*ecs_os_api.cond_wait_)(*(ecs_os_cond_t *)(lVar1 + 0x5bc0),*(ecs_os_mutex_t *)(lVar1 + 0x5bd0))
    ;
  }
  (*ecs_os_api.mutex_unlock_)(*(ecs_os_mutex_t *)(lVar1 + 0x5bd0));
  while (((*(byte *)(lVar1 + 0x5c90) ^ 0xff) & 1) != 0) {
    scope = ecs_set_scope((ecs_world_t *)arg,0);
    ecs_pipeline_progress
              ((ecs_world_t *)arg,*(ecs_entity_t *)(lVar1 + 0x5ad8),*(float *)(lVar1 + 0x5c1c));
    ecs_set_scope((ecs_world_t *)arg,scope);
  }
  (*ecs_os_api.mutex_lock_)(*(ecs_os_mutex_t *)(lVar1 + 0x5bd0));
  *(int *)(lVar1 + 0x5bd8) = *(int *)(lVar1 + 0x5bd8) + -1;
  (*ecs_os_api.mutex_unlock_)(*(ecs_os_mutex_t *)(lVar1 + 0x5bd0));
  return (void *)0x0;
}

Assistant:

static
void* worker(void *arg) {
    ecs_thread_t *thread = arg;
    ecs_world_t *world = thread->world;

    /* Start worker thread, increase counter so main thread knows how many
     * workers are ready */
    ecs_os_mutex_lock(world->sync_mutex);
    world->workers_running ++;

    if (!world->quit_workers) {
        ecs_os_cond_wait(world->worker_cond, world->sync_mutex);
    }

    ecs_os_mutex_unlock(world->sync_mutex);

    while (!world->quit_workers) {
        ecs_entity_t old_scope = ecs_set_scope((ecs_world_t*)thread, 0);
        ecs_pipeline_progress(
            (ecs_world_t*)thread, 
            world->pipeline, 
            world->stats.delta_time);
        ecs_set_scope((ecs_world_t*)thread, old_scope);
    }

    ecs_os_mutex_lock(world->sync_mutex);
    world->workers_running --;
    ecs_os_mutex_unlock(world->sync_mutex);

    return NULL;
}